

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varintdecode.c
# Opt level: O0

size_t read_ints_single(uint8_t *in,uint32_t *out,int length)

{
  int iVar1;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  int count;
  size_t consumed;
  undefined4 local_24;
  undefined8 local_20;
  
  local_20 = 0;
  for (local_24 = 0; local_24 < in_EDX; local_24 = local_24 + 1) {
    iVar1 = read_int((uint8_t *)(in_RDI + local_20),(uint32_t *)(in_RSI + (long)local_24 * 4));
    local_20 = (long)iVar1 + local_20;
  }
  return local_20;
}

Assistant:

size_t read_ints_single(const uint8_t *in, uint32_t *out, int length) {
  size_t consumed = 0;
  for (int count = 0; count < length; count++) {
    consumed += read_int(in + consumed, out + count);
  }
  return consumed;
}